

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_Tt8CnfSize(word *t,int nVars)

{
  int iVar1;
  int iVar2;
  word uRes [4];
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  word local_48 [5];
  
  local_68 = (uint)*t ^ 0xffffffff;
  uStack_64 = *(uint *)((long)t + 4) ^ 0xffffffff;
  uStack_60 = (uint)t[1] ^ 0xffffffff;
  uStack_5c = *(uint *)((long)t + 0xc) ^ 0xffffffff;
  local_58 = (uint)t[2] ^ 0xffffffff;
  uStack_54 = *(uint *)((long)t + 0x14) ^ 0xffffffff;
  uStack_50 = (uint)t[3] ^ 0xffffffff;
  uStack_4c = *(uint *)((long)t + 0x1c) ^ 0xffffffff;
  iVar1 = Abc_Tt8Isop(t,t,nVars,local_48);
  iVar2 = Abc_Tt8Isop((word *)&local_68,(word *)&local_68,nVars,local_48);
  if (iVar2 + iVar1 < 0x101) {
    return iVar2 + iVar1;
  }
  __assert_fail("nCubes <= 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x973,"int Abc_Tt8CnfSize(word *, int)");
}

Assistant:

static inline int Abc_Tt8CnfSize( word t[4], int nVars )
{
    word uRes[4], tc[4] = {~t[0], ~t[1], ~t[2], ~t[3]};
    int nCubes = 0;
    nCubes += Abc_Tt8Isop( t,  t,  nVars, uRes );
    nCubes += Abc_Tt8Isop( tc, tc, nVars, uRes );
    assert( nCubes <= 256 );
    return nCubes;
}